

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkFromBarBufs(Abc_Ntk_t *pNtkBase,Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  void *pvVar3;
  long lVar4;
  long *plVar5;
  Nm_Man_t *pNVar6;
  Abc_Ntk_t *pAVar7;
  long lVar8;
  Abc_Des_t *pAVar9;
  void **ppvVar10;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pAVar11;
  long *plVar12;
  char *pcVar13;
  Vec_Ptr_t *pVVar14;
  Vec_Ptr_t *pVVar15;
  long lVar16;
  uint uVar17;
  undefined8 uVar18;
  long lVar19;
  Vec_Ptr_t *vLoMaps;
  Vec_Ptr_t *vLiMaps;
  Vec_Ptr_t *local_40;
  Vec_Ptr_t *local_38;
  
  if (pNtkBase->pDesign == (Abc_Des_t *)0x0) {
    __assert_fail("pNtkBase->pDesign != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x10d,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x10e,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkBase->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtkBase)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x10f,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkBase->nObjCounts[8] != 0) {
    __assert_fail("Abc_NtkLatchNum(pNtkBase) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x110,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[8] != pNtk->nBarBufs) {
    __assert_fail("Abc_NtkLatchNum(pNtk) == pNtk->nBarBufs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x111,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[9] != 0) {
    __assert_fail("Abc_NtkWhiteboxNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x112,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[10] != 0) {
    __assert_fail("Abc_NtkBlackboxNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x113,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtk->vPis->nSize != pNtkBase->vPis->nSize) {
    __assert_fail("Abc_NtkPiNum(pNtk) == Abc_NtkPiNum(pNtkBase)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x114,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtk->vPos->nSize != pNtkBase->vPos->nSize) {
    __assert_fail("Abc_NtkPoNum(pNtk) == Abc_NtkPoNum(pNtkBase)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x115,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  Abc_NtkCleanCopy_rec(pNtkBase);
  pAVar9 = pNtkBase->pDesign;
  pVVar14 = pAVar9->vModules;
  if (0 < pVVar14->nSize) {
    lVar19 = 0;
    do {
      pAVar2 = (Abc_Ntk_t *)pVVar14->pArray[lVar19];
      pAVar7 = Abc_NtkStartFrom(pAVar2,pNtk->ntkType,pNtk->ntkFunc);
      pAVar2->pCopy = pAVar7;
      lVar19 = lVar19 + 1;
      pAVar9 = pNtkBase->pDesign;
      pVVar14 = pAVar9->vModules;
      iVar1 = pVVar14->nSize;
    } while (lVar19 < iVar1);
    if (0 < iVar1) {
      ppvVar10 = pVVar14->pArray;
      lVar19 = 0;
      do {
        lVar16 = *(long *)((long)ppvVar10[lVar19] + 0xb8);
        if (lVar16 == 0) {
          uVar18 = 0;
        }
        else {
          uVar18 = *(undefined8 *)(lVar16 + 0x160);
        }
        *(undefined8 *)(*(long *)((long)ppvVar10[lVar19] + 0x160) + 0xb8) = uVar18;
        lVar19 = lVar19 + 1;
      } while (iVar1 != lVar19);
      if (0 < iVar1) {
        lVar19 = 0;
        do {
          pvVar3 = pVVar14->pArray[lVar19];
          lVar16 = *(long *)((long)pvVar3 + 0x50);
          if (0 < *(int *)(lVar16 + 4)) {
            lVar8 = 0;
            do {
              lVar4 = *(long *)(*(long *)(lVar16 + 8) + lVar8 * 8);
              uVar17 = *(uint *)(lVar4 + 0x14) & 0xf;
              if (uVar17 == 9) {
                *(undefined8 *)(*(long *)(lVar4 + 0x40) + 0x38) =
                     *(undefined8 *)(*(long *)(lVar4 + 0x38) + 0x160);
                lVar16 = *(long *)((long)pvVar3 + 0x50);
              }
              else if (uVar17 == 10) {
                __assert_fail("pObj->Type == ABC_OBJ_WHITEBOX",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                              ,0x151,"Abc_Ntk_t *Abc_ObjModel(Abc_Obj_t *)");
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < *(int *)(lVar16 + 4));
            pAVar9 = pNtkBase->pDesign;
          }
          lVar19 = lVar19 + 1;
          pVVar14 = pAVar9->vModules;
        } while (lVar19 < pVVar14->nSize);
      }
    }
  }
  pAVar2 = pNtkBase->pCopy;
  pAVar9 = Abc_DesCreate(pAVar9->pName);
  pAVar2->pDesign = pAVar9;
  pAVar9 = pNtkBase->pDesign;
  pVVar14 = pAVar9->vModules;
  if (0 < pVVar14->nSize) {
    lVar19 = 0;
    do {
      Abc_DesAddModel(pAVar2->pDesign,*(Abc_Ntk_t **)((long)pVVar14->pArray[lVar19] + 0x160));
      lVar19 = lVar19 + 1;
      pAVar9 = pNtkBase->pDesign;
      pVVar14 = pAVar9->vModules;
    } while (lVar19 < pVVar14->nSize);
  }
  pVVar14 = pAVar9->vTops;
  if (0 < pVVar14->nSize) {
    lVar19 = 0;
    do {
      pVVar15 = pAVar2->pDesign->vTops;
      pvVar3 = *(void **)((long)pVVar14->pArray[lVar19] + 0x160);
      uVar17 = pVVar15->nSize;
      if (uVar17 == pVVar15->nCap) {
        if ((int)uVar17 < 0x10) {
          if (pVVar15->pArray == (void **)0x0) {
            ppvVar10 = (void **)malloc(0x80);
          }
          else {
            ppvVar10 = (void **)realloc(pVVar15->pArray,0x80);
          }
          pVVar15->pArray = ppvVar10;
          pVVar15->nCap = 0x10;
        }
        else {
          if (pVVar15->pArray == (void **)0x0) {
            ppvVar10 = (void **)malloc((ulong)uVar17 << 4);
          }
          else {
            ppvVar10 = (void **)realloc(pVVar15->pArray,(ulong)uVar17 << 4);
          }
          pVVar15->pArray = ppvVar10;
          pVVar15->nCap = uVar17 * 2;
        }
      }
      else {
        ppvVar10 = pVVar15->pArray;
      }
      iVar1 = pVVar15->nSize;
      pVVar15->nSize = iVar1 + 1;
      ppvVar10[iVar1] = pvVar3;
      lVar19 = lVar19 + 1;
      pVVar14 = pNtkBase->pDesign->vTops;
    } while (lVar19 < pVVar14->nSize);
  }
  pVVar14 = pAVar2->pDesign->vTops;
  if (0 < pVVar14->nSize) {
    if ((Abc_Ntk_t *)*pVVar14->pArray != pAVar2) {
      __assert_fail("Vec_PtrEntry(pNtkNew->pDesign->vTops, 0) == pNtkNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                    ,0x128,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    Abc_NtkCleanCopy(pNtk);
    pVVar14 = pNtk->vPis;
    if (0 < pVVar14->nSize) {
      lVar19 = 0;
      do {
        if (pAVar2->vPis->nSize <= lVar19) goto LAB_0084e6c3;
        *(void **)((long)pVVar14->pArray[lVar19] + 0x40) = pAVar2->vPis->pArray[lVar19];
        lVar19 = lVar19 + 1;
        pVVar14 = pNtk->vPis;
      } while (lVar19 < pVVar14->nSize);
    }
    pVVar14 = pNtk->vPos;
    if (0 < pVVar14->nSize) {
      lVar19 = 0;
      do {
        if (pAVar2->vPos->nSize <= lVar19) goto LAB_0084e6c3;
        *(void **)((long)pVVar14->pArray[lVar19] + 0x40) = pAVar2->vPos->pArray[lVar19];
        lVar19 = lVar19 + 1;
        pVVar14 = pNtk->vPos;
      } while (lVar19 < pVVar14->nSize);
    }
    Abc_NtkCollectPiPos(pNtkBase,&local_38,&local_40);
    iVar1 = local_38->nSize;
    if (iVar1 != pNtk->nObjCounts[8]) {
      __assert_fail("Vec_PtrSize(vLiMaps) == Abc_NtkLatchNum(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                    ,0x130,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    if (local_40->nSize != iVar1) {
      __assert_fail("Vec_PtrSize(vLoMaps) == Abc_NtkLatchNum(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                    ,0x131,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    if (0 < iVar1) {
      lVar19 = 0;
      do {
        if ((local_40->nSize <= lVar19) || (pNtk->vBoxes->nSize <= lVar19)) goto LAB_0084e6c3;
        pvVar3 = local_40->pArray[lVar19];
        plVar5 = (long *)pNtk->vBoxes->pArray[lVar19];
        *(undefined8 *)
         (*(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) + (long)*(int *)plVar5[4] * 8) + 0x40)
             = *(undefined8 *)((long)local_38->pArray[lVar19] + 0x40);
        *(undefined8 *)
         (*(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) + (long)*(int *)plVar5[6] * 8) + 0x40)
             = *(undefined8 *)((long)pvVar3 + 0x40);
        lVar19 = lVar19 + 1;
      } while (lVar19 < local_38->nSize);
    }
    if (local_38->pArray != (void **)0x0) {
      free(local_38->pArray);
    }
    free(local_38);
    if (local_40->pArray != (void **)0x0) {
      free(local_40->pArray);
    }
    free(local_40);
    pVVar14 = pNtk->vCos;
    if (0 < pVVar14->nSize) {
      lVar19 = 0;
      do {
        plVar5 = (long *)pVVar14->pArray[lVar19];
        pAVar11 = (Abc_Obj_t *)plVar5[8];
        pFanin = Abc_NtkFromBarBufs_rec
                           (pAVar11->pNtk,
                            *(Abc_Obj_t **)
                             (*(long *)(*(long *)(*plVar5 + 0x20) + 8) + (long)*(int *)plVar5[4] * 8
                             ));
        Abc_ObjAddFanin(pAVar11,pFanin);
        lVar19 = lVar19 + 1;
        pVVar14 = pNtk->vCos;
      } while (lVar19 < pVVar14->nSize);
    }
    pVVar15 = pNtk->vCis;
    if (0 < pVVar15->nSize) {
      lVar19 = 0;
      do {
        plVar5 = (long *)pVVar15->pArray[lVar19];
        plVar12 = (long *)plVar5[8];
        if (*(int *)((long)plVar12 + 0x2c) == 0) {
          pAVar11 = Abc_NtkCreateObj((Abc_Ntk_t *)*plVar12,ABC_OBJ_NET);
          Abc_ObjAddFanin(pAVar11,(Abc_Obj_t *)plVar5[8]);
          plVar12 = (long *)plVar5[8];
        }
        pNVar6 = *(Nm_Man_t **)(*plVar12 + 0x18);
        lVar16 = *(long *)(*(long *)(*(long *)(*plVar12 + 0x20) + 8) + (long)*(int *)plVar12[6] * 8)
        ;
        iVar1 = *(int *)(lVar16 + 0x10);
        uVar17 = *(uint *)(lVar16 + 0x14);
        pcVar13 = Abc_ObjName(*(Abc_Obj_t **)
                               (*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                               (long)*(int *)plVar5[6] * 8));
        Nm_ManStoreIdName(pNVar6,iVar1,uVar17 & 0xf,pcVar13,(char *)0x0);
        lVar19 = lVar19 + 1;
        pVVar15 = pNtk->vCis;
      } while (lVar19 < pVVar15->nSize);
      pVVar14 = pNtk->vCos;
    }
    if (0 < pVVar14->nSize) {
      lVar19 = 0;
      do {
        plVar5 = (long *)pVVar14->pArray[lVar19];
        lVar16 = *(long *)plVar5[8];
        pNVar6 = *(Nm_Man_t **)(lVar16 + 0x18);
        lVar16 = *(long *)(*(long *)(*(long *)(lVar16 + 0x20) + 8) +
                          (long)*(int *)((long *)plVar5[8])[4] * 8);
        iVar1 = *(int *)(lVar16 + 0x10);
        uVar17 = *(uint *)(lVar16 + 0x14);
        pcVar13 = Abc_ObjName(*(Abc_Obj_t **)
                               (*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                               (long)*(int *)plVar5[4] * 8));
        Nm_ManStoreIdName(pNVar6,iVar1,uVar17 & 0xf,pcVar13,(char *)0x0);
        lVar19 = lVar19 + 1;
        pVVar14 = pNtk->vCos;
      } while (lVar19 < pVVar14->nSize);
    }
    return pAVar2;
  }
LAB_0084e6c3:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkFromBarBufs( Abc_Ntk_t * pNtkBase, Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew, * pTemp;
    Vec_Ptr_t * vLiMaps, * vLoMaps;
    Abc_Obj_t * pObj, * pLiMap, * pLoMap;
    int i, k;
    assert( pNtkBase->pDesign != NULL );
    assert( Abc_NtkIsNetlist(pNtk) );
    assert( Abc_NtkIsNetlist(pNtkBase) );
    assert( Abc_NtkLatchNum(pNtkBase) == 0 );
    assert( Abc_NtkLatchNum(pNtk) == pNtk->nBarBufs );
    assert( Abc_NtkWhiteboxNum(pNtk) == 0 );
    assert( Abc_NtkBlackboxNum(pNtk) == 0 );
    assert( Abc_NtkPiNum(pNtk) == Abc_NtkPiNum(pNtkBase) );
    assert( Abc_NtkPoNum(pNtk) == Abc_NtkPoNum(pNtkBase) );
    // start networks
    Abc_NtkCleanCopy_rec( pNtkBase );
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtkBase->pDesign->vModules, pTemp, i )
        pTemp->pCopy = Abc_NtkStartFrom( pTemp, pNtk->ntkType, pNtk->ntkFunc );
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtkBase->pDesign->vModules, pTemp, i )
        pTemp->pCopy->pAltView = pTemp->pAltView ? pTemp->pAltView->pCopy : NULL;
    // update box models
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtkBase->pDesign->vModules, pTemp, i )
        Abc_NtkForEachBox( pTemp, pObj, k )
            if ( Abc_ObjIsWhitebox(pObj) || Abc_ObjIsBlackbox(pObj) )
                pObj->pCopy->pData = Abc_ObjModel(pObj)->pCopy;
    // create the design
    pNtkNew = pNtkBase->pCopy;
    pNtkNew->pDesign = Abc_DesCreate( pNtkBase->pDesign->pName );
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtkBase->pDesign->vModules, pTemp, i )
        Abc_DesAddModel( pNtkNew->pDesign, pTemp->pCopy );
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtkBase->pDesign->vTops, pTemp, i )
        Vec_PtrPush( pNtkNew->pDesign->vTops, pTemp->pCopy );
    assert( Vec_PtrEntry(pNtkNew->pDesign->vTops, 0) == pNtkNew );
    // transfer copy attributes to pNtk
    Abc_NtkCleanCopy( pNtk );
    Abc_NtkForEachPi( pNtk, pObj, i )
        pObj->pCopy = Abc_NtkPi(pNtkNew, i);
    Abc_NtkForEachPo( pNtk, pObj, i )
        pObj->pCopy = Abc_NtkPo(pNtkNew, i);
    Abc_NtkCollectPiPos( pNtkBase, &vLiMaps, &vLoMaps );
    assert( Vec_PtrSize(vLiMaps) == Abc_NtkLatchNum(pNtk) );
    assert( Vec_PtrSize(vLoMaps) == Abc_NtkLatchNum(pNtk) );
    Vec_PtrForEachEntryTwo( Abc_Obj_t *, vLiMaps, Abc_Obj_t *, vLoMaps, pLiMap, pLoMap, i )
    {
        pObj = Abc_NtkBox( pNtk, i );
        Abc_ObjFanin0(pObj)->pCopy = pLiMap->pCopy; 
        Abc_ObjFanout0(pObj)->pCopy = pLoMap->pCopy; 
    }
    Vec_PtrFree( vLiMaps );
    Vec_PtrFree( vLoMaps );
    // create internal nodes
    Abc_NtkForEachCo( pNtk, pObj, i )
        Abc_ObjAddFanin( pObj->pCopy, Abc_NtkFromBarBufs_rec(pObj->pCopy->pNtk, Abc_ObjFanin0(pObj)) );
    // transfer net names
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        if ( Abc_ObjFanoutNum(pObj->pCopy) == 0 ) // handle PI without fanout
            Abc_ObjAddFanin( Abc_NtkCreateNet(pObj->pCopy->pNtk), pObj->pCopy );
        Nm_ManStoreIdName( pObj->pCopy->pNtk->pManName, Abc_ObjFanout0(pObj->pCopy)->Id, Abc_ObjFanout0(pObj->pCopy)->Type, Abc_ObjName(Abc_ObjFanout0(pObj)), NULL );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
        Nm_ManStoreIdName( pObj->pCopy->pNtk->pManName, Abc_ObjFanin0(pObj->pCopy)->Id, Abc_ObjFanin0(pObj->pCopy)->Type, Abc_ObjName(Abc_ObjFanin0(pObj)), NULL );
    return pNtkNew;
}